

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder.cc
# Opt level: O0

void __thiscall S2Builder::Init(S2Builder *this,Options *options)

{
  bool bVar1;
  int32 iVar2;
  ostream *poVar3;
  double extraout_XMM0_Qa;
  double dVar4;
  double dVar5;
  S1Angle SVar6;
  S1ChordAngle SVar7;
  double d;
  S1ChordAngle local_148;
  double local_140;
  S1ChordAngle local_138;
  double local_130;
  byte local_121;
  S2LogMessage local_120;
  S2LogMessageVoidify local_109;
  double local_108;
  S1Angle local_100;
  double local_f8;
  S1Angle local_f0;
  double local_e8;
  double local_e0;
  double local_d8;
  double local_d0;
  S1Angle local_c8;
  double local_c0;
  S1ChordAngle local_b8;
  double local_b0;
  double local_a8;
  S1Angle local_a0;
  double local_98;
  double local_90;
  undefined8 local_88;
  S1Angle local_80;
  S1Angle edge_snap_radius;
  S1ChordAngle local_70 [3];
  byte local_51;
  S2LogMessage local_50;
  S2LogMessageVoidify local_39;
  double local_38;
  S1Angle local_30;
  S1Angle local_28;
  S1Angle snap_radius;
  SnapFunction *snap_function;
  Options *options_local;
  S2Builder *this_local;
  
  Options::operator=(&this->options_,options);
  snap_radius.radians_ = (double)Options::snap_function(options);
  (*((SnapFunction *)snap_radius.radians_)->_vptr_SnapFunction[2])();
  local_30.radians_ = extraout_XMM0_Qa;
  local_28.radians_ = extraout_XMM0_Qa;
  local_38 = (double)SnapFunction::kMaxSnapRadius();
  bVar1 = operator<=(local_30,(S1Angle)local_38);
  local_51 = 0;
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&local_50,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2builder.cc"
               ,0xc5,kFatal,(ostream *)&std::cerr);
    local_51 = 1;
    poVar3 = S2LogMessage::stream(&local_50);
    poVar3 = std::operator<<(poVar3,
                             "Check failed: (snap_radius) <= (SnapFunction::kMaxSnapRadius()) ");
    S2LogMessageVoidify::operator&(&local_39,poVar3);
  }
  if ((local_51 & 1) != 0) {
    S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_50);
  }
  edge_snap_radius.radians_ = local_28.radians_;
  S1ChordAngle::S1ChordAngle(local_70,local_28);
  (this->site_snap_radius_ca_).length2_ = local_70[0].length2_;
  local_80.radians_ = local_28.radians_;
  bVar1 = Options::split_crossing_edges(options);
  if (bVar1) {
    local_88 = 0x3cd0000000000000;
    S1Angle::operator+=(&local_80,(S1Angle)0x3cd0000000000000);
    local_98 = local_80.radians_;
    local_90 = (double)RoundUp(local_80);
    (this->edge_snap_radius_ca_).length2_ = local_90;
  }
  else {
    (this->edge_snap_radius_ca_).length2_ = (this->site_snap_radius_ca_).length2_;
  }
  local_a0.radians_ = local_80.radians_;
  local_a8 = (double)S1Angle::Zero();
  bVar1 = operator>(local_a0,(S1Angle)local_a8);
  this->snapping_requested_ = bVar1;
  local_b0 = (double)SnapFunction::max_edge_deviation(snap_radius.radians_);
  (this->max_edge_deviation_).radians_ = local_b0;
  local_c8.radians_ = (this->max_edge_deviation_).radians_;
  local_d0 = (double)(**(code **)(*(long *)snap_radius.radians_ + 0x20))();
  local_c0 = (double)::operator+(local_c8,(S1Angle)local_d0);
  S1ChordAngle::S1ChordAngle(&local_b8,(S1Angle)local_c0);
  (this->edge_site_query_radius_ca_).length2_ = local_b8.length2_;
  local_e0 = local_28.radians_;
  dVar4 = sin(local_28.radians_);
  local_e8 = (this->max_edge_deviation_).radians_;
  dVar5 = sin(local_e8);
  dVar4 = acos(dVar4 / dVar5);
  local_d8 = (double)S1ChordAngle::Radians(dVar4 * 2.0);
  (this->min_edge_length_to_split_ca_).length2_ = local_d8;
  local_f0 = SnapFunction::max_edge_deviation(snap_radius.radians_);
  local_100.radians_ = (double)(**(code **)(*(long *)snap_radius.radians_ + 0x10))();
  local_108 = (double)(**(code **)(*(long *)snap_radius.radians_ + 0x20))();
  local_f8 = (double)::operator+(local_100,(S1Angle)local_108);
  bVar1 = operator<=(local_f0,(S1Angle)local_f8);
  local_121 = 0;
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&local_120,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2builder.cc"
               ,0xf5,kFatal,(ostream *)&std::cerr);
    local_121 = 1;
    poVar3 = S2LogMessage::stream(&local_120);
    poVar3 = std::operator<<(poVar3,
                             "Check failed: (snap_function.max_edge_deviation()) <= (snap_function.snap_radius() + snap_function.min_edge_vertex_separation()) "
                            );
    S2LogMessageVoidify::operator&(&local_109,poVar3);
  }
  if ((local_121 & 1) != 0) {
    S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_120);
  }
  local_130 = (double)(**(code **)(*(long *)snap_radius.radians_ + 0x18))();
  (this->min_site_separation_).radians_ = local_130;
  local_140 = (this->min_site_separation_).radians_;
  S1ChordAngle::S1ChordAngle(&local_138,(S1Angle)local_140);
  (this->min_site_separation_ca_).length2_ = local_138.length2_;
  SVar6.radians_ = (double)(**(code **)(*(long *)snap_radius.radians_ + 0x20))();
  S1ChordAngle::S1ChordAngle(&local_148,SVar6);
  (this->min_edge_site_separation_ca_).length2_ = local_148.length2_;
  SVar7 = AddPointToEdgeError((this->min_edge_site_separation_ca_).length2_);
  (this->min_edge_site_separation_ca_limit_).length2_ = SVar7.length2_;
  SVar6 = ::operator*(2.0,local_80);
  SVar7 = RoundUp(SVar6);
  SVar7 = AddPointToPointError(SVar7);
  (this->max_adjacent_site_separation_ca_).length2_ = SVar7.length2_;
  dVar4 = sin(local_80.radians_);
  this->edge_snap_radius_sin2_ = dVar4 * dVar4;
  dVar5 = sqrt(3.0);
  this->edge_snap_radius_sin2_ =
       ((dVar4 * 9.5 + 2.5 + dVar5 * 2.0) * dVar4 + 1.9984014443252818e-15) * 2.220446049250313e-16
       + this->edge_snap_radius_sin2_;
  iVar2 = IdSetLexicon::EmptySetId();
  this->label_set_id_ = iVar2;
  this->label_set_modified_ = false;
  this->snapping_needed_ = false;
  return;
}

Assistant:

void S2Builder::Init(const Options& options) {
  options_ = options;
  const SnapFunction& snap_function = options.snap_function();
  S1Angle snap_radius = snap_function.snap_radius();
  S2_DCHECK_LE(snap_radius, SnapFunction::kMaxSnapRadius());

  // Convert the snap radius to an S1ChordAngle.  This is the "true snap
  // radius" used when evaluating exact predicates (s2predicates.h).
  site_snap_radius_ca_ = S1ChordAngle(snap_radius);

  // When split_crossing_edges() is true, we need to use a larger snap radius
  // for edges than for vertices to ensure that both edges are snapped to the
  // edge intersection location.  This is because the computed intersection
  // point is not exact; it may be up to kIntersectionError away from its true
  // position.  The computed intersection point might then be snapped to some
  // other vertex up to snap_radius away.  So to ensure that both edges are
  // snapped to a common vertex, we need to increase the snap radius for edges
  // to at least the sum of these two values (calculated conservatively).
  S1Angle edge_snap_radius = snap_radius;
  if (!options.split_crossing_edges()) {
    edge_snap_radius_ca_ = site_snap_radius_ca_;
  } else {
    edge_snap_radius += S2::kIntersectionError;
    edge_snap_radius_ca_ = RoundUp(edge_snap_radius);
  }
  snapping_requested_ = (edge_snap_radius > S1Angle::Zero());

  // Compute the maximum distance that a vertex can be separated from an
  // edge while still affecting how that edge is snapped.
  max_edge_deviation_ = snap_function.max_edge_deviation();
  edge_site_query_radius_ca_ = S1ChordAngle(
      max_edge_deviation_ + snap_function.min_edge_vertex_separation());

  // Compute the maximum edge length such that even if both endpoints move by
  // the maximum distance allowed (i.e., snap_radius), the center of the edge
  // will still move by less than max_edge_deviation().  This saves us a lot
  // of work since then we don't need to check the actual deviation.
  min_edge_length_to_split_ca_ = S1ChordAngle::Radians(
      2 * acos(sin(snap_radius) / sin(max_edge_deviation_)));

  // If the condition below is violated, then AddExtraSites() needs to be
  // modified to check that snapped edges pass on the same side of each "site
  // to avoid" as the input edge.  Currently it doesn't need to do this
  // because the condition below guarantees that if the snapped edge passes on
  // the wrong side of the site then it is also too close, which will cause a
  // separation site to be added.
  //
  // Currently max_edge_deviation() is at most 1.1 * snap_radius(), whereas
  // min_edge_vertex_separation() is at least 0.219 * snap_radius() (based on
  // S2CellIdSnapFunction, which is currently the worst case).
  S2_DCHECK_LE(snap_function.max_edge_deviation(),
            snap_function.snap_radius() +
            snap_function.min_edge_vertex_separation());

  // To implement idempotency, we check whether the input geometry could
  // possibly be the output of a previous S2Builder invocation.  This involves
  // testing whether any site/site or edge/site pairs are too close together.
  // This is done using exact predicates, which require converting the minimum
  // separation values to an S1ChordAngle.
  min_site_separation_ = snap_function.min_vertex_separation();
  min_site_separation_ca_ = S1ChordAngle(min_site_separation_);
  min_edge_site_separation_ca_ =
      S1ChordAngle(snap_function.min_edge_vertex_separation());

  // This is an upper bound on the distance computed by S2ClosestPointQuery
  // where the true distance might be less than min_edge_site_separation_ca_.
  min_edge_site_separation_ca_limit_ =
      AddPointToEdgeError(min_edge_site_separation_ca_);

  // Compute the maximum possible distance between two sites whose Voronoi
  // regions touch.  (The maximum radius of each Voronoi region is
  // edge_snap_radius_.)  Then increase this bound to account for errors.
  max_adjacent_site_separation_ca_ =
      AddPointToPointError(RoundUp(2 * edge_snap_radius));

  // Finally, we also precompute sin^2(edge_snap_radius), which is simply the
  // squared distance between a vertex and an edge measured perpendicular to
  // the plane containing the edge, and increase this value by the maximum
  // error in the calculation to compare this distance against the bound.
  double d = sin(edge_snap_radius);
  edge_snap_radius_sin2_ = d * d;
  edge_snap_radius_sin2_ += ((9.5 * d + 2.5 + 2 * sqrt(3)) * d +
                             9 * DBL_EPSILON) * DBL_EPSILON;

  // Initialize the current label set.
  label_set_id_ = label_set_lexicon_.EmptySetId();
  label_set_modified_ = false;

  // If snapping was requested, we try to determine whether the input geometry
  // already meets the output requirements.  This is necessary for
  // idempotency, and can also save work.  If we discover any reason that the
  // input geometry needs to be modified, snapping_needed_ is set to true.
  snapping_needed_ = false;
}